

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Nan_Test::Body(iu_SyntaxTest_x_iutest_x_Nan_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  AssertionHelper local_7b8;
  Fixed local_788;
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5a8;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  double dnan;
  iu_SyntaxTest_x_iutest_x_Nan_Test *piStack_10;
  float fnan;
  iu_SyntaxTest_x_iutest_x_Nan_Test *this_local;
  
  piStack_10 = this;
  dnan._4_4_ = std::numeric_limits<float>::quiet_NaN();
  iutest_ar._32_8_ = std::numeric_limits<double>::quiet_NaN();
  if ((dnan._4_4_ != 0.0) || (NAN(dnan._4_4_))) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperIsNan<float>((AssertionResult *)local_48,"fnan",(float *)((long)&dnan + 4));
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      memset(&local_1e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,dnan._4_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_48);
      iutest::AssertionHelper::AssertionHelper
                (&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1eb,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_210,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_210);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    if (iutest_ar_1._36_4_ != 0) {
      return;
    }
  }
  if ((dnan._4_4_ != 0.0) || (NAN(dnan._4_4_))) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperIsNan<float>((AssertionResult *)local_240,"fnan",(float *)((long)&dnan + 4));
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3c8,dnan._4_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1ed,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  if (((double)iutest_ar._32_8_ != 0.0) || (NAN((double)iutest_ar._32_8_))) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperIsNan<double>
              ((AssertionResult *)local_420,"dnan",(double *)&iutest_ar.m_result);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5a8,(double)iutest_ar._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1ef,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  }
  if (((double)iutest_ar._32_8_ != 0.0) || (NAN((double)iutest_ar._32_8_))) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperIsNan<double>
              ((AssertionResult *)local_600,"dnan",(double *)&iutest_ar.m_result);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      memset(&local_788,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_788);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_788,(double)iutest_ar._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_600);
      iutest::AssertionHelper::AssertionHelper
                (&local_7b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1f1,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7b8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7b8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_788);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, Nan)
{
    float  fnan = ::std::numeric_limits<float>::quiet_NaN();
    double dnan = ::std::numeric_limits<double>::quiet_NaN();
    if( fnan )
        IUTEST_ASSERT_NAN(fnan) << fnan;
    if( fnan )
        IUTEST_EXPECT_NAN(fnan) << fnan;
    if( dnan )
        IUTEST_INFORM_NAN(dnan) << dnan;
    if( dnan )
        IUTEST_ASSUME_NAN(dnan) << dnan;
}